

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.hpp
# Opt level: O2

int __thiscall diy::io::SharedOutFile::close(SharedOutFile *this,int __fd)

{
  undefined1 *puVar1;
  int root;
  pointer pvVar2;
  int iVar3;
  vector<char,_std::allocator<char>_> *cntnts;
  pointer pvVar4;
  vector<char,_std::allocator<char>_> contents;
  __string_type str;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  all_contents;
  ofstream fout;
  
  if (*(int *)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
               field_0xa8 < 0) {
    contents.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    puVar1 = &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x90;
    iVar3 = *(int *)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                     field_0x98;
    if (0 < iVar3) {
      mpi::communicator::recv<int>
                ((status *)&fout,(communicator *)puVar1,iVar3 + -1,0,(int *)&contents);
    }
    std::ofstream::ofstream
              (&fout,(string *)
                     &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>
                      .field_0x70,_S_app);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&fout,(string *)&str);
    std::__cxx11::string::~string((string *)&str);
    iVar3 = *(int *)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                     field_0x98;
    if (iVar3 < *(int *)&(this->super_ostringstream).
                         super_basic_ostream<char,_std::char_traits<char>_>.field_0x9c + -1) {
      mpi::communicator::send<int>((communicator *)puVar1,iVar3 + 1,0,(int *)&contents);
    }
    mpi::communicator::barrier((communicator *)puVar1);
    iVar3 = std::ofstream::~ofstream(&fout);
  }
  else {
    std::__cxx11::stringbuf::str();
    std::vector<char,std::allocator<char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((vector<char,std::allocator<char>> *)&contents,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )str._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(str._M_dataplus._M_p + str._M_string_length),(allocator_type *)&fout);
    puVar1 = &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x90;
    iVar3 = *(int *)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                     field_0x98;
    root = *(int *)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    field_0xa8;
    if (iVar3 == root) {
      all_contents.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      all_contents.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      all_contents.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      mpi::Collectives<char,_void_*>::gather((communicator *)puVar1,&contents,&all_contents,iVar3);
      std::ofstream::ofstream
                (&fout,(string *)
                       &(this->super_ostringstream).
                        super_basic_ostream<char,_std::char_traits<char>_>.field_0x70,_S_out);
      pvVar2 = all_contents.
               super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar4 = all_contents.
                    super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar2; pvVar4 = pvVar4 + 1
          ) {
        std::ostream::write((char *)&fout,
                            (long)(pvVar4->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                  super__Vector_impl_data._M_start);
      }
      std::ofstream::~ofstream(&fout);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::~vector(&all_contents);
    }
    else {
      mpi::Collectives<char,_void_*>::gather((communicator *)puVar1,&contents,root);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&contents.super__Vector_base<char,_std::allocator<char>_>);
    iVar3 = std::__cxx11::string::~string((string *)&str);
  }
  return iVar3;
}

Assistant:

void    close()
        {
            if (root_ >= 0)
            {
                auto str = this->str();
                std::vector<char> contents(str.begin(), str.end());
                if (world_.rank() == root_)
                {
                    std::vector<std::vector<char>> all_contents;
                    diy::mpi::gather(world_, contents, all_contents, root_);

                    // write the file serially
                    std::ofstream fout(filename_);
                    for (auto& cntnts : all_contents)
                        fout.write(cntnts.data(), cntnts.size());
                } else
                    diy::mpi::gather(world_, contents, root_);
            } else
            {
                int x = 0;
                if (world_.rank() > 0)
                    world_.recv(world_.rank() - 1, 0, x);

                std::ofstream fout(filename_, std::ios_base::app);
                fout << this->str();

                if (world_.rank() < world_.size() - 1)
                    world_.send(world_.rank() + 1, 0, x);

                world_.barrier();
            }
        }